

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matdet.c
# Opt level: O0

double mat_det(MATRIX a)

{
  int iVar1;
  MATRIX A_00;
  MATRIX P_00;
  long in_RDI;
  double result;
  int n;
  int j;
  int i;
  MATRIX P;
  MATRIX A;
  MATRIX in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  int type;
  double dVar2;
  int in_stack_ffffffffffffffd8;
  int local_20;
  
  type = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  iVar1 = *(int *)(in_RDI + -8);
  A_00 = mat_copy((MATRIX)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  P_00 = mat_creat(iVar1,in_stack_ffffffffffffffd8,type);
  iVar1 = mat_lu(A_00,P_00);
  if (iVar1 == -1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 1.0;
    for (local_20 = 0; local_20 < *(int *)(A_00 + -1); local_20 = local_20 + 1) {
      dVar2 = A_00[(int)*P_00[local_20]][local_20] * dVar2;
    }
    dVar2 = signa[iVar1 % 2] * dVar2;
  }
  mat_free(in_stack_ffffffffffffffc8);
  mat_free(in_stack_ffffffffffffffc8);
  return dVar2;
}

Assistant:

double mat_det( MATRIX a )
{
	MATRIX	A, P;
	int	i, j, n;
	double	result;

	n = MatRow(a);
	A = mat_copy(a);
	P = mat_creat(n, 1, UNDEFINED);

	/*
	* take a LUP-decomposition
	*/
	i = mat_lu(A, P);
	switch (i)
		{
		/*
		* case for singular matrix
		*/
		case -1:
		result = 0.0;
		break;

		/*
		* normal case: |A| = |L||U||P|
		* |L| = 1,
		* |U| = multiplication of the diagonal
		* |P| = +-1
		*/
		default:
		result = 1.0;
		for (j=0; j<MatRow(A); j++)
			{
			result *= A[(int)P[j][0]][j];
			}
		result *= signa[i%2];
		break;
		}

	mat_free(A);
	mat_free(P);
	return (result);
}